

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O3

mk_iov * mk_iov_realloc(mk_iov *mk_io,int new_size)

{
  int iVar1;
  uint uVar2;
  iovec *piVar3;
  iovec *piVar4;
  mk_iov *pmVar5;
  ulong uVar6;
  long lVar7;
  
  pmVar5 = mk_iov_create(new_size,0);
  if (pmVar5 != (mk_iov *)0x0) {
    iVar1 = mk_io->iov_idx;
    pmVar5->iov_idx = iVar1;
    uVar2 = mk_io->buf_idx;
    pmVar5->buf_idx = uVar2;
    pmVar5->size = new_size;
    pmVar5->total_len = mk_io->total_len;
    if (0 < (long)iVar1) {
      piVar3 = mk_io->io;
      piVar4 = pmVar5->io;
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&piVar4->iov_base + lVar7) =
             *(undefined8 *)((long)&piVar3->iov_base + lVar7);
        *(undefined8 *)((long)&piVar4->iov_len + lVar7) =
             *(undefined8 *)((long)&piVar3->iov_len + lVar7);
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar1 * 0x10 != lVar7);
    }
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        pmVar5->buf_to_free[uVar6] = mk_io->buf_to_free[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  return pmVar5;
}

Assistant:

struct mk_iov *mk_iov_realloc(struct mk_iov *mk_io, int new_size)
{
    int i;
    struct mk_iov *iov;

    /*
     * We do not perform a memory realloc because our struct iov have
     * self references on it 'io' and 'buf_to_free' pointers. So we create a
     * new mk_iov and perform a data migration.
     */
    iov = mk_iov_create(new_size, 0);
    if (!iov) {
        return NULL;
    }

    /* Migrate data */
    iov->iov_idx   = mk_io->iov_idx;
    iov->buf_idx   = mk_io->buf_idx;
    iov->size      = new_size;
    iov->total_len = mk_io->total_len;

    for (i = 0; i < mk_io->iov_idx; i++) {
        iov->io[i].iov_base = mk_io->io[i].iov_base;
        iov->io[i].iov_len  = mk_io->io[i].iov_len;
    }

    for (i = 0; i < mk_io->buf_idx; i++) {
        iov->buf_to_free[i] = mk_io->buf_to_free[i];
    }

    return iov;
}